

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

TValue * lj_tab_setinth(lua_State *L,GCtab *t,int32_t key)

{
  TValue *pTVar1;
  uint uVar2;
  uint uVar4;
  TValue k;
  cTValue local_8;
  uint uVar3;
  
  local_8.n = (lua_Number)key;
  uVar3 = (uint)(local_8.u64 >> 0x1f);
  uVar2 = uVar3 & 0xfffffffe;
  uVar4 = (uVar2 ^ local_8.u32.lo) - (uVar2 << 0xe | uVar3 >> 0x12);
  pTVar1 = (TValue *)
           ((ulong)(t->node).ptr32 +
           (ulong)(((uVar2 << 0x13 | uVar3 >> 0xd) ^ uVar4) - (uVar4 * 0x2000 | uVar4 >> 0x13) &
                  t->hmask) * 0x18);
  do {
    if (*(uint *)((long)pTVar1 + 0xc) < 0xfffeffff) {
      if ((pTVar1[1].n == local_8.n) && (!NAN(pTVar1[1].n) && !NAN(local_8.n))) {
        return pTVar1;
      }
    }
    pTVar1 = (TValue *)(ulong)pTVar1[2].u32.lo;
    if (pTVar1 == (TValue *)0x0) {
      pTVar1 = lj_tab_newkey(L,t,&local_8);
      return pTVar1;
    }
  } while( true );
}

Assistant:

TValue *lj_tab_setinth(lua_State *L, GCtab *t, int32_t key)
{
  TValue k;
  Node *n;
  k.n = (lua_Number)key;
  n = hashnum(t, &k);
  do {
    if (tvisnum(&n->key) && n->key.n == k.n)
      return &n->val;
  } while ((n = nextnode(n)));
  return lj_tab_newkey(L, t, &k);
}